

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O0

int Path::glob(char *__pattern,int __flags,__errfunc *__errfunc,glob_t *__pglob)

{
  int iVar1;
  char *__pattern_00;
  int local_6c;
  undefined1 auStack_68 [4];
  int i;
  glob_t g;
  string *pattern_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *results;
  
  g.gl_stat._7_1_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__pattern);
  __pattern_00 = (char *)std::__cxx11::string::c_str();
  iVar1 = ::glob(__pattern_00,0x1401,(__errfunc *)0x0,(glob_t *)auStack_68);
  if (iVar1 == 0) {
    for (local_6c = 0; local_6c < (int)_auStack_68; local_6c = local_6c + 1) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)__pattern,
                 (char **)(g.gl_pathc + (long)local_6c * 8));
    }
  }
  globfree((glob_t *)auStack_68);
  return (int)__pattern;
}

Assistant:

std::vector <std::string> Path::glob (const std::string& pattern)
{
  std::vector <std::string> results;

  glob_t g;
#ifdef SOLARIS
  if (!::glob (pattern.c_str (), GLOB_ERR, nullptr, &g))
#else
  if (!::glob (pattern.c_str (), GLOB_ERR | GLOB_BRACE | GLOB_TILDE, nullptr, &g))
#endif
    for (int i = 0; i < (int) g.gl_pathc; ++i)
      results.emplace_back (g.gl_pathv[i]);

  globfree (&g);
  return results;
}